

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O2

void find_cost_range(cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float delta,
                    float eta,float *min_pred,float *max_pred,bool *is_range_large)

{
  ostream *poVar1;
  char *pcVar2;
  float sens;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_union_4_2_947300a4 x;
  
  LEARNER::learner<char,_example>::predict(base,ec,(ulong)(i - 1));
  sens = LEARNER::learner<char,_example>::sensitivity(base,ec,(ulong)(i - 1));
  if ((cs_a->t < 2) || ((~(uint)sens & 0x7f800000) == 0)) {
    *min_pred = cs_a->cost_min;
    *max_pred = cs_a->cost_max;
    *is_range_large = true;
    if (cs_a->print_debug_stuff == false) {
      return;
    }
    pcVar2 = "  find_cost_rangeA: i=";
  }
  else {
    fVar4 = (ec->pred).scalar;
    fVar5 = cs_a->cost_max;
    fVar3 = binarySearch(fVar5 - fVar4,delta,sens,1e-06);
    fVar4 = fVar3 * sens + fVar4;
    if (fVar4 <= fVar5) {
      fVar5 = fVar4;
    }
    *max_pred = fVar5;
    fVar4 = (ec->pred).scalar;
    fVar5 = cs_a->cost_min;
    fVar3 = binarySearch(fVar4 - fVar5,delta,sens,1e-06);
    fVar4 = fVar4 - fVar3 * sens;
    if (fVar5 <= fVar4) {
      fVar5 = fVar4;
    }
    *min_pred = fVar5;
    *is_range_large = eta < *max_pred - fVar5;
    if (cs_a->print_debug_stuff != true) {
      return;
    }
    pcVar2 = "  find_cost_rangeB: i=";
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," pp=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ec->partial_prediction);
  poVar1 = std::operator<<(poVar1," sens=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sens);
  poVar1 = std::operator<<(poVar1," eta=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,eta);
  poVar1 = std::operator<<(poVar1," [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*min_pred);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*max_pred);
  poVar1 = std::operator<<(poVar1,"] = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*max_pred - *min_pred);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

inline void find_cost_range(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float delta, float eta,
    float& min_pred, float& max_pred, bool& is_range_large)
{
  float tol = 1e-6f;

  base.predict(ec, i - 1);
  float sens = base.sensitivity(ec, i - 1);

  if (cs_a.t <= 1 || nanpattern(sens) || infpattern(sens))
  {
    min_pred = cs_a.cost_min;
    max_pred = cs_a.cost_max;
    is_range_large = true;
    if (cs_a.print_debug_stuff)
      cerr << "  find_cost_rangeA: i=" << i << " pp=" << ec.partial_prediction << " sens=" << sens << " eta=" << eta
           << " [" << min_pred << ", " << max_pred << "] = " << (max_pred - min_pred) << endl;
  }
  else
  {
    // finding max_pred and min_pred by binary search
    max_pred =
        min(ec.pred.scalar + sens * binarySearch(cs_a.cost_max - ec.pred.scalar, delta, sens, tol), cs_a.cost_max);
    min_pred =
        max(ec.pred.scalar - sens * binarySearch(ec.pred.scalar - cs_a.cost_min, delta, sens, tol), cs_a.cost_min);
    is_range_large = (max_pred - min_pred > eta);
    if (cs_a.print_debug_stuff)
      cerr << "  find_cost_rangeB: i=" << i << " pp=" << ec.partial_prediction << " sens=" << sens << " eta=" << eta
           << " [" << min_pred << ", " << max_pred << "] = " << (max_pred - min_pred) << endl;
  }
}